

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O2

char * serialize_get(char *r,SBufExt *sbx,TValue *o)

{
  long lVar1;
  byte bVar2;
  uint64_t *w;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t uVar6;
  GCstr *pGVar7;
  void *pvVar8;
  GCtab *t;
  char *r_00;
  TValue *pTVar9;
  short sVar10;
  undefined8 in_RCX;
  uint64_t uVar11;
  uint32_t uVar12;
  ulong uVar13;
  ErrMsg em;
  lua_State *L;
  uint uVar14;
  TValue *cdo;
  uint64_t *r_01;
  byte *r_02;
  uint64_t *puVar15;
  uint32_t tp;
  undefined4 local_54;
  uint32_t nhash;
  uint32_t narray;
  uint32_t idx;
  ulong local_40;
  MRef *local_38;
  
  w = (uint64_t *)sbx->w;
  if (w <= r) goto LAB_001218d1;
  uVar13 = (ulong)(byte)*r;
  r_01 = (uint64_t *)(r + 1);
  tp = (uint32_t)(byte)*r;
  if (0xdf < tp) {
    r_01 = (uint64_t *)serialize_ru124_((char *)r_01,(char *)w,&tp);
    if (r_01 == (uint64_t *)0x0) goto LAB_001218d1;
    uVar13 = (ulong)tp;
  }
  uVar14 = (uint)uVar13;
  if (0x1f < uVar14) {
    uVar14 = uVar14 - 0x20;
    if (uVar14 <= (uint)((int)w - (int)r_01)) {
      pGVar7 = lj_str_new((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),(char *)r_01,
                          (ulong)uVar14);
      o->u64 = (ulong)pGVar7 | 0xfffd800000000000;
      return (char *)(byte *)((long)r_01 + (ulong)uVar14);
    }
    goto LAB_001218d1;
  }
  if (uVar14 == 7) {
    if (r_01 + 1 <= w) {
      uVar11 = 0xfff8000000000000;
      if ((ushort)(*r_01 >> 0x30) < 0xfff9) {
        uVar11 = *r_01;
      }
      o->u64 = uVar11;
      return (char *)(r_01 + 1);
    }
    goto LAB_001218d1;
  }
  if (uVar14 == 6) {
    if ((uint64_t *)((long)r_01 + 4U) <= w) {
      o->n = (double)(int)(uint)*r_01;
      return (char *)(uint64_t *)((long)r_01 + 4U);
    }
    goto LAB_001218d1;
  }
  if (uVar14 < 3) {
    o->u64 = ~(uVar13 << 0x2f);
    return (char *)r_01;
  }
  if (uVar14 == 0xf) {
    if (w <= r_01) goto LAB_001218d1;
    r_02 = (byte *)((long)r_01 + 1);
    idx = (uint32_t)(byte)*r_01;
    if ((0xdf < idx) &&
       (r_02 = (byte *)serialize_ru124_((char *)r_02,(char *)w,&idx), r_02 == (byte *)0x0))
    goto LAB_001218d1;
    uVar14 = idx + 1;
    uVar13 = (ulong)uVar14;
    uVar11 = (sbx->dict_str).gcptr64;
    if ((uVar11 != 0) &&
       ((uVar14 < *(uint *)(uVar11 + 0x30) &&
        (aVar3 = *(anon_struct_8_2_7fa0a05d_for_TValue_4 *)
                  (*(long *)(uVar11 + 0x10) + (ulong)uVar14 * 8), aVar3.it >> 0xf == 0x1fffb)))) {
      o->field_4 = aVar3;
      return (char *)r_02;
    }
    goto LAB_001218e3;
  }
  if (6 < uVar14 - 8) {
    if (uVar14 - 0x10 < 3) {
      if (w < r_01 + (ulong)(uVar14 == 0x12) + 1) goto LAB_001218d1;
      L = (lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8);
      if (*(long *)((L->glref).ptr64 + 0x180) != 0) {
        lVar1 = (ulong)(uVar14 == 0x12) * 8;
        local_40 = lVar1 + 8;
        pvVar8 = lj_mem_newgco(L,lVar1 + 0x18);
        *(undefined1 *)((long)pvVar8 + 9) = 10;
        sVar10 = 0xb;
        if (uVar14 != 0x10) {
          sVar10 = (ushort)(uVar14 != 0x11) * 4 + 0xc;
        }
        *(short *)((long)pvVar8 + 10) = sVar10;
        memcpy((undefined8 *)((long)pvVar8 + 0x10),r_01,local_40);
        if (uVar14 == 0x12) {
          if (0xfff8 < *(ushort *)((long)pvVar8 + 0x16)) {
            *(undefined8 *)((long)pvVar8 + 0x10) = 0xfff8000000000000;
          }
          if (0xfff8ffffffffffff < *(ulong *)((long)pvVar8 + 0x18)) {
            *(undefined8 *)((long)pvVar8 + 0x18) = 0xfff8000000000000;
          }
        }
        o->u64 = (ulong)pvVar8 | 0xfffa800000000000;
        return (char *)(r_01 + (ulong)(uVar14 == 0x12) + 1);
      }
    }
    else if (uVar14 < 6) {
      if (uVar14 == 5) {
        puVar15 = r_01 + 1;
        if (w < puVar15) goto LAB_001218d1;
        pvVar8 = (void *)*r_01;
      }
      else if (uVar14 == 4) {
        puVar15 = (uint64_t *)((long)r_01 + 4);
        if (w < puVar15) goto LAB_001218d1;
        pvVar8 = (void *)(ulong)(uint)*r_01;
      }
      else {
        pvVar8 = (void *)0x0;
        puVar15 = r_01;
      }
      pvVar8 = lj_lightud_intern((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),pvVar8);
      o->u64 = (ulong)pvVar8 | 0xfffe000000000000;
      return (char *)puVar15;
    }
LAB_0012183b:
    uVar4 = (sbx->L).ptr64;
    em = LJ_ERR_BUFFER_BADDEC;
    goto LAB_0012184b;
  }
  narray = 0;
  nhash = 0;
  if (sbx->depth < 1) {
    lj_err_caller((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DEPTH);
  }
  sbx->depth = sbx->depth + -1;
  if (uVar14 == 0xe) {
    if (w <= r_01) goto LAB_001218d1;
    bVar2 = (byte)*r_01;
    idx = (uint32_t)bVar2;
    puVar15 = (uint64_t *)((long)r_01 + 1);
    if ((0xdf < bVar2) &&
       (idx = (uint)bVar2, puVar15 = (uint64_t *)serialize_ru124_((char *)puVar15,(char *)w,&idx),
       puVar15 == (uint64_t *)0x0)) goto LAB_001218d1;
    idx = idx + 1;
    uVar13 = (ulong)idx;
    uVar11 = (sbx->dict_mt).gcptr64;
    if ((uVar11 != 0) && (idx < *(uint *)(uVar11 + 0x30))) {
      local_40 = *(ulong *)(*(long *)(uVar11 + 0x10) + uVar13 * 8);
      in_RCX = 0;
      if ((local_40 & 0xffff800000000000) == 0xfffa000000000000) {
        if (w <= puVar15) goto LAB_001218d1;
        uVar13 = (ulong)(byte)*puVar15;
        r_01 = (uint64_t *)((long)puVar15 + 1);
        tp = (uint32_t)(byte)*puVar15;
        if (0xdf < tp) {
          r_01 = (uint64_t *)serialize_ru124_((char *)r_01,(char *)w,&tp);
          if (r_01 == (uint64_t *)0x0) goto LAB_001218d1;
          uVar13 = (ulong)tp;
        }
        if (5 < (int)uVar13 - 8U) goto LAB_0012183b;
        local_40 = local_40 & 0x7fffffffffff;
        goto LAB_0012166d;
      }
    }
LAB_001218e3:
    uVar4 = (sbx->L).ptr64;
    em = LJ_ERR_BUFFER_BADDICTX;
LAB_0012184b:
    lj_err_callerv((lua_State *)(uVar4 & 0xfffffffffffffff8),em,uVar13);
  }
  local_40 = 0;
LAB_0012166d:
  if (9 < (uint)uVar13) {
    if (w <= r_01) goto LAB_001218d1;
    uVar11 = *r_01;
    r_01 = (uint64_t *)((long)r_01 + 1);
    narray = (uint32_t)(byte)uVar11;
    if ((0xdf < narray) &&
       (r_01 = (uint64_t *)serialize_ru124_((char *)r_01,(char *)w,&narray), r_01 == (uint64_t *)0x0
       )) goto LAB_001218d1;
  }
  if ((uVar13 & 1) == 0) {
    uVar11 = (sbx->L).ptr64;
    local_54 = (undefined4)CONCAT71((int7)((ulong)&sbx->L >> 8),1);
    uVar12 = 0;
LAB_0012174d:
    uVar6 = narray;
    local_38 = &sbx->L;
    t = lj_tab_new((lua_State *)(uVar11 & 0xfffffffffffffff8),narray,uVar12);
    (t->metatable).gcptr64 = local_40;
    o->u64 = (ulong)t | 0xfffa000000000000;
    if (uVar6 != 0) {
      uVar11 = (t->array).ptr64;
      for (pTVar9 = (TValue *)(uVar11 + (ulong)(0xb < (uint)uVar13) * 8);
          pTVar9 < (TValue *)(uVar11 + (ulong)uVar6 * 8); pTVar9 = pTVar9 + 1) {
        r_01 = (uint64_t *)serialize_get((char *)r_01,sbx,pTVar9);
      }
    }
    if ((char)local_54 == '\0') {
      do {
        r_00 = serialize_get((char *)r_01,sbx,(cTValue *)&idx);
        pTVar9 = lj_tab_set((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),t,(cTValue *)&idx);
        if (pTVar9->u64 != 0xffffffffffffffff) {
          lj_err_caller((lua_State *)(local_38->ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DUPKEY);
        }
        r_01 = (uint64_t *)serialize_get(r_00,sbx,pTVar9);
        nhash = nhash - 1;
      } while (nhash != 0);
    }
    sbx->depth = sbx->depth + 1;
    return (char *)r_01;
  }
  if (r_01 < w) {
    uVar11 = *r_01;
    r_01 = (uint64_t *)((long)r_01 + 1);
    nhash = (uint32_t)(byte)uVar11;
    if ((nhash < 0xe0) ||
       (r_01 = (uint64_t *)serialize_ru124_((char *)r_01,(char *)w,&nhash), r_01 != (uint64_t *)0x0)
       ) {
      uVar11 = (sbx->L).ptr64;
      uVar12 = nhash;
      if (nhash == 0) {
        local_54 = (undefined4)CONCAT71((int7)((ulong)&sbx->L >> 8),1);
      }
      else {
        uVar14 = nhash - 1;
        if (uVar14 == 0) {
          local_54 = 0;
        }
        else {
          local_54 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),nhash == 0);
          uVar5 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar12 = (uVar5 ^ 0xffffffe0) + 0x21;
        }
      }
      goto LAB_0012174d;
    }
  }
LAB_001218d1:
  lj_err_caller((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_EOB);
}

Assistant:

static char *serialize_get(char *r, SBufExt *sbx, TValue *o)
{
  char *w = sbx->w;
  uint32_t tp;
  r = serialize_ru124(r, w, &tp); if (LJ_UNLIKELY(!r)) goto eob;
  if (LJ_LIKELY(tp >= SER_TAG_STR)) {
    uint32_t len = tp - SER_TAG_STR;
    if (LJ_UNLIKELY(len > (uint32_t)(w - r))) goto eob;
    setstrV(sbufL(sbx), o, lj_str_new(sbufL(sbx), r, len));
    r += len;
  } else if (tp == SER_TAG_INT) {
    if (LJ_UNLIKELY(r + 4 > w)) goto eob;
    setintV(o, (int32_t)(LJ_BE ? lj_bswap(lj_getu32(r)) : lj_getu32(r)));
    r += 4;
  } else if (tp == SER_TAG_NUM) {
    if (LJ_UNLIKELY(r + 8 > w)) goto eob;
    memcpy(o, r, 8); r += 8;
#if LJ_BE
    o->u64 = lj_bswap64(o->u64);
#endif
    if (!tvisnum(o)) setnanV(o);  /* Fix non-canonical NaNs. */
  } else if (tp <= SER_TAG_TRUE) {
    setpriV(o, ~tp);
  } else if (tp == SER_TAG_DICT_STR) {
    GCtab *dict_str;
    uint32_t idx;
    r = serialize_ru124(r, w, &idx); if (LJ_UNLIKELY(!r)) goto eob;
    idx++;
    dict_str = tabref(sbx->dict_str);
    if (dict_str && idx < dict_str->asize && tvisstr(arrayslot(dict_str, idx)))
      copyTV(sbufL(sbx), o, arrayslot(dict_str, idx));
    else
      lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDICTX, idx);
  } else if (tp >= SER_TAG_TAB && tp <= SER_TAG_DICT_MT) {
    uint32_t narray = 0, nhash = 0;
    GCtab *t, *mt = NULL;
    if (sbx->depth <= 0) lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DEPTH);
    sbx->depth--;
    if (tp == SER_TAG_DICT_MT) {
      GCtab *dict_mt;
      uint32_t idx;
      r = serialize_ru124(r, w, &idx); if (LJ_UNLIKELY(!r)) goto eob;
      idx++;
      dict_mt = tabref(sbx->dict_mt);
      if (dict_mt && idx < dict_mt->asize && tvistab(arrayslot(dict_mt, idx)))
	mt = tabV(arrayslot(dict_mt, idx));
      else
	lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDICTX, idx);
      r = serialize_ru124(r, w, &tp); if (LJ_UNLIKELY(!r)) goto eob;
      if (!(tp >= SER_TAG_TAB && tp < SER_TAG_DICT_MT)) goto badtag;
    }
    if (tp >= SER_TAG_TAB+2) {
      r = serialize_ru124(r, w, &narray); if (LJ_UNLIKELY(!r)) goto eob;
    }
    if ((tp & 1)) {
      r = serialize_ru124(r, w, &nhash); if (LJ_UNLIKELY(!r)) goto eob;
    }
    t = lj_tab_new(sbufL(sbx), narray, hsize2hbits(nhash));
    /* NOBARRIER: The table is new (marked white). */
    setgcref(t->metatable, obj2gco(mt));
    settabV(sbufL(sbx), o, t);
    if (narray) {
      TValue *oa = tvref(t->array) + (tp >= SER_TAG_TAB+4);
      TValue *oe = tvref(t->array) + narray;
      while (oa < oe) r = serialize_get(r, sbx, oa++);
    }
    if (nhash) {
      do {
	TValue k, *v;
	r = serialize_get(r, sbx, &k);
	v = lj_tab_set(sbufL(sbx), t, &k);
	if (LJ_UNLIKELY(!tvisnil(v)))
	  lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DUPKEY);
	r = serialize_get(r, sbx, v);
      } while (--nhash);
    }
    sbx->depth++;
#if LJ_HASFFI
  } else if (tp >= SER_TAG_INT64 &&  tp <= SER_TAG_COMPLEX) {
    uint32_t sz = tp == SER_TAG_COMPLEX ? 16 : 8;
    GCcdata *cd;
    if (LJ_UNLIKELY(r + sz > w)) goto eob;
    if (LJ_UNLIKELY(!ctype_ctsG(G(sbufL(sbx))))) goto badtag;
    cd = lj_cdata_new_(sbufL(sbx),
	   tp == SER_TAG_INT64 ? CTID_INT64 :
	   tp == SER_TAG_UINT64 ? CTID_UINT64 : CTID_COMPLEX_DOUBLE,
	   sz);
    memcpy(cdataptr(cd), r, sz); r += sz;
#if LJ_BE
    *(uint64_t *)cdataptr(cd) = lj_bswap64(*(uint64_t *)cdataptr(cd));
    if (sz == 16)
      ((uint64_t *)cdataptr(cd))[1] = lj_bswap64(((uint64_t *)cdataptr(cd))[1]);
#endif
    if (sz == 16) {  /* Fix non-canonical NaNs. */
      TValue *cdo = (TValue *)cdataptr(cd);
      if (!tvisnum(&cdo[0])) setnanV(&cdo[0]);
      if (!tvisnum(&cdo[1])) setnanV(&cdo[1]);
    }
    setcdataV(sbufL(sbx), o, cd);
#endif
  } else if (tp <= (LJ_64 ? SER_TAG_LIGHTUD64 : SER_TAG_LIGHTUD32)) {
    uintptr_t ud = 0;
    if (tp == SER_TAG_LIGHTUD32) {
      if (LJ_UNLIKELY(r + 4 > w)) goto eob;
      ud = (uintptr_t)(LJ_BE ? lj_bswap(lj_getu32(r)) : lj_getu32(r));
      r += 4;
    }
#if LJ_64
    else if (tp == SER_TAG_LIGHTUD64) {
      if (LJ_UNLIKELY(r + 8 > w)) goto eob;
      memcpy(&ud, r, 8); r += 8;
#if LJ_BE
      ud = lj_bswap64(ud);
#endif
    }
    setrawlightudV(o, lj_lightud_intern(sbufL(sbx), (void *)ud));
#else
    setrawlightudV(o, (void *)ud);
#endif
  } else {
badtag:
    lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDEC, tp);
  }
  return r;
eob:
  lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_EOB);
  return NULL;
}